

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNativeCoordMappingTests.cpp
# Opt level: O0

bool deqp::egl::anon_unknown_0::validate
               (TestLog *log,TextureLevel *result,int rectX,int rectY,int rectW,int rectH)

{
  bool bVar1;
  float fVar2;
  bool bVar3;
  int iVar4;
  int height;
  ConstPixelBufferAccess local_2d8;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  LogImage local_260;
  ConstPixelBufferAccess local_1d0;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  LogImage local_158;
  RGBA local_c8;
  RGBA local_c4;
  RGBA local_c0;
  RGBA local_bc;
  RGBA local_b8;
  RGBA local_b4;
  ConstPixelBufferAccess local_b0;
  undefined1 local_88 [8];
  Vec4 resultColor;
  int x;
  int local_68;
  int y;
  bool isOk;
  Surface errorMask;
  Vec4 white;
  Vec4 black;
  int rectH_local;
  int rectW_local;
  int rectY_local;
  int rectX_local;
  TextureLevel *result_local;
  TestLog *log_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(white.m_data + 2),0.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&errorMask.m_pixels.m_cap,1.0,1.0,1.0,1.0);
  iVar4 = tcu::TextureLevel::getWidth(result);
  height = tcu::TextureLevel::getHeight(result);
  tcu::Surface::Surface((Surface *)&y,iVar4,height);
  bVar1 = true;
  for (local_68 = 0; iVar4 = tcu::TextureLevel::getHeight(result), local_68 < iVar4;
      local_68 = local_68 + 1) {
    for (resultColor.m_data[2] = 0.0; fVar2 = resultColor.m_data[2],
        iVar4 = tcu::TextureLevel::getWidth(result), (int)fVar2 < iVar4;
        resultColor.m_data[2] = (float)((int)resultColor.m_data[2] + 1)) {
      tcu::TextureLevel::getAccess(&local_b0,result);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_88,(int)&local_b0,(int)resultColor.m_data[2],
                 local_68);
      if ((((rectX < (int)resultColor.m_data[2]) &&
           ((int)resultColor.m_data[2] < rectX + rectW + -1)) && (rectY < local_68)) &&
         (local_68 < rectY + rectH + -1)) {
        bVar3 = compareColor((Vec4 *)local_88,(Vec4 *)&errorMask.m_pixels.m_cap);
        fVar2 = resultColor.m_data[2];
        if (bVar3) {
          tcu::RGBA::RGBA(&local_b8,0,0xff,0,0xff);
          tcu::Surface::setPixel((Surface *)&y,(int)fVar2,local_68,local_b8);
        }
        else {
          tcu::RGBA::RGBA(&local_b4,0xff,0,0,0xff);
          tcu::Surface::setPixel((Surface *)&y,(int)fVar2,local_68,local_b4);
          bVar1 = false;
        }
      }
      else if ((((int)resultColor.m_data[2] < rectX + -1) ||
               (rectX + rectW < (int)resultColor.m_data[2])) ||
              ((local_68 < rectY + -1 || (rectY + rectH < local_68)))) {
        bVar3 = compareColor((Vec4 *)local_88,(Vec4 *)(white.m_data + 2));
        fVar2 = resultColor.m_data[2];
        if (bVar3) {
          tcu::RGBA::RGBA(&local_c0,0,0xff,0,0xff);
          tcu::Surface::setPixel((Surface *)&y,(int)fVar2,local_68,local_c0);
        }
        else {
          tcu::RGBA::RGBA(&local_bc,0xff,0,0,0xff);
          tcu::Surface::setPixel((Surface *)&y,(int)fVar2,local_68,local_bc);
          bVar1 = false;
        }
      }
      else {
        bVar3 = compareColor((Vec4 *)local_88,(Vec4 *)(white.m_data + 2));
        if ((bVar3) ||
           (bVar3 = compareColor((Vec4 *)local_88,(Vec4 *)&errorMask.m_pixels.m_cap),
           fVar2 = resultColor.m_data[2], bVar3)) {
          fVar2 = resultColor.m_data[2];
          tcu::RGBA::RGBA(&local_c8,0,0xff,0,0xff);
          tcu::Surface::setPixel((Surface *)&y,(int)fVar2,local_68,local_c8);
        }
        else {
          tcu::RGBA::RGBA(&local_c4,0xff,0,0,0xff);
          tcu::Surface::setPixel((Surface *)&y,(int)fVar2,local_68,local_c4);
          bVar1 = false;
        }
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"Result",&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"Result of rendering",&local_1a1);
  tcu::TextureLevel::getAccess(&local_1d0,result);
  tcu::LogImage::LogImage
            (&local_158,&local_178,&local_1a0,&local_1d0,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(log,&local_158);
  tcu::LogImage::~LogImage(&local_158);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  if (bVar1 == false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"Error Mask",&local_281)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"Error Mask",&local_2a9)
    ;
    tcu::Surface::getAccess((PixelBufferAccess *)&local_2d8,(Surface *)&y);
    tcu::LogImage::LogImage
              (&local_260,&local_280,&local_2a8,&local_2d8,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(log,&local_260);
    tcu::LogImage::~LogImage(&local_260);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
  }
  tcu::Surface::~Surface((Surface *)&y);
  return bVar1;
}

Assistant:

bool validate (TestLog& log, const tcu::TextureLevel& result, int rectX, int rectY, int rectW, int rectH)
{
	const tcu::Vec4		black		(0.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4		white		(1.0f, 1.0f, 1.0f, 1.0f);
	tcu::Surface		errorMask	(result.getWidth(), result.getHeight());
	bool				isOk		= true;

	for (int y = 0; y < result.getHeight(); y++)
	{
		for (int x = 0; x < result.getWidth(); x++)
		{
			const tcu::Vec4 resultColor = result.getAccess().getPixel(x, y);

			if (x > rectX && x < rectX + rectW - 1 && y > rectY && y < rectY + rectH - 1)
			{
				if (!compareColor(resultColor, white))
				{
					errorMask.setPixel(x, y, tcu::RGBA(255, 0, 0, 255));
					isOk = false;
				}
				else
					errorMask.setPixel(x, y, tcu::RGBA(0, 255, 0, 255));
			}
			else if (x < rectX-1 || x > rectX + rectW || y < rectY-1 || y > rectY + rectH)
			{
				if (!compareColor(resultColor, black))
				{
					errorMask.setPixel(x, y, tcu::RGBA(255, 0, 0, 255));
					isOk = false;
				}
				else
					errorMask.setPixel(x, y, tcu::RGBA(0, 255, 0, 255));
			}
			else
			{
				// Pixel is close to edge of reference rectangle

				if (!compareColor(resultColor, black) && !compareColor(resultColor, white))
				{
					errorMask.setPixel(x, y, tcu::RGBA(255, 0, 0, 255));
					isOk = false;
				}
				else
					errorMask.setPixel(x, y, tcu::RGBA(0, 255, 0, 255));
			}
		}
	}

	log << TestLog::Image("Result", "Result of rendering", result.getAccess());

	if (!isOk)
		log << TestLog::Image("Error Mask", "Error Mask", errorMask.getAccess());

	return isOk;
}